

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unicornafl.cpp
# Opt level: O3

void __thiscall
UCAFL::_uc_hook_sub_impl_64(UCAFL *this,uint64_t cur_loc,uint64_t arg1,uint64_t arg2)

{
  ulong uVar1;
  
  uVar1 = arg1 ^ arg2;
  if ((((uVar1 >> 0x38 == 0) &&
       (this->afl_area_ptr_[cur_loc + 6 ^ this->afl_prev_loc_] =
             this->afl_area_ptr_[cur_loc + 6 ^ this->afl_prev_loc_] + '\x01', uVar1 >> 0x30 == 0))
      && (this->afl_area_ptr_[cur_loc + 5 ^ this->afl_prev_loc_] =
               this->afl_area_ptr_[cur_loc + 5 ^ this->afl_prev_loc_] + '\x01', uVar1 >> 0x28 == 0))
     && (((this->afl_area_ptr_[cur_loc + 4 ^ this->afl_prev_loc_] =
                this->afl_area_ptr_[cur_loc + 4 ^ this->afl_prev_loc_] + '\x01', uVar1 >> 0x20 == 0
          && (this->afl_area_ptr_[cur_loc + 3 ^ this->afl_prev_loc_] =
                   this->afl_area_ptr_[cur_loc + 3 ^ this->afl_prev_loc_] + '\x01',
             uVar1 < 0x1000000)) &&
         ((this->afl_area_ptr_[cur_loc + 2 ^ this->afl_prev_loc_] =
                this->afl_area_ptr_[cur_loc + 2 ^ this->afl_prev_loc_] + '\x01', uVar1 < 0x10000 &&
          (this->afl_area_ptr_[cur_loc + 1 ^ this->afl_prev_loc_] =
                this->afl_area_ptr_[cur_loc + 1 ^ this->afl_prev_loc_] + '\x01', uVar1 < 0x100))))))
  {
    this->afl_area_ptr_[cur_loc ^ this->afl_prev_loc_] =
         this->afl_area_ptr_[cur_loc ^ this->afl_prev_loc_] + '\x01';
  }
  return;
}

Assistant:

void _uc_hook_sub_impl_64(uint64_t cur_loc, uint64_t arg1, uint64_t arg2) {
        if ((arg1 & 0xff00000000000000) == (arg2 & 0xff00000000000000)) {

            this->afl_area_ptr_[(cur_loc + 6) ^ this->afl_prev_loc_]++;
            if ((arg1 & 0xff000000000000) == (arg2 & 0xff000000000000)) {

                this->afl_area_ptr_[(cur_loc + 5) ^ this->afl_prev_loc_]++;
                if ((arg1 & 0xff0000000000) == (arg2 & 0xff0000000000)) {

                    this->afl_area_ptr_[(cur_loc + 4) ^ this->afl_prev_loc_]++;
                    if ((arg1 & 0xff00000000) == (arg2 & 0xff00000000)) {

                        this->afl_area_ptr_[(cur_loc + 3) ^
                                            this->afl_prev_loc_]++;
                        if ((arg1 & 0xff000000) == (arg2 & 0xff000000)) {

                            this->afl_area_ptr_[(cur_loc + 2) ^
                                                this->afl_prev_loc_]++;
                            if ((arg1 & 0xff0000) == (arg2 & 0xff0000)) {

                                this->afl_area_ptr_[(cur_loc + 1) ^
                                                    this->afl_prev_loc_]++;
                                if ((arg1 & 0xff00) == (arg2 & 0xff00)) {
                                    this->afl_area_ptr_[(cur_loc) ^
                                                        this->afl_prev_loc_]++;
                                }
                            }
                        }
                    }
                }
            }
        }
    }